

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ReportWarning
          (ParserImpl *this,int line,int col,string_view message)

{
  LogMessage *pLVar1;
  DescriptorStringView psVar2;
  byte local_111;
  byte local_b1;
  LogMessage local_80 [16];
  uint32_t local_70;
  byte local_69;
  uint32_t COUNTER_1;
  undefined4 uStack_64;
  bool absl_log_internal_stateful_condition_do_log_1;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  LogMessage local_40 [16];
  uint32_t local_30;
  byte local_29;
  uint32_t COUNTER;
  int iStack_24;
  bool absl_log_internal_stateful_condition_do_log;
  int col_local;
  int line_local;
  ParserImpl *this_local;
  string_view message_local;
  
  message_local._M_len = (size_t)message._M_str;
  this_local = (ParserImpl *)message._M_len;
  COUNTER = col;
  iStack_24 = line;
  _col_local = this;
  if (this->error_collector_ == (ErrorCollector *)0x0) {
    if (line < 0) {
      local_69 = 1;
      while (local_69 != 0) {
        while( true ) {
          local_111 = 0;
          if (local_69 != 0) {
            local_111 = absl::lts_20240722::log_internal::LogEveryPow2State::ShouldLog();
          }
          if ((local_111 & 1) == 0) break;
          local_70 = absl::lts_20240722::log_internal::LogEveryPow2State::counter
                               (&ReportWarning(int,int,std::basic_string_view<char,std::char_traits<char>>)
                                 ::absl_log_internal_stateful_condition_state);
          while ((local_69 & 1) != 0) {
            absl::lts_20240722::log_internal::LogMessage::LogMessage
                      (local_80,
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/text_format.cc"
                       ,0x1c2);
            pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream(local_80);
            pLVar1 = absl::lts_20240722::log_internal::LogMessage::operator<<
                               (pLVar1,(char (*) [29])"Warning parsing text-format ");
            psVar2 = Descriptor::full_name_abi_cxx11_(this->root_message_type_);
            pLVar1 = (LogMessage *)
                     absl::lts_20240722::log_internal::LogMessage::operator<<
                               (pLVar1,(string *)psVar2);
            pLVar1 = absl::lts_20240722::log_internal::LogMessage::operator<<
                               (pLVar1,(char (*) [7])" (N = ");
            pLVar1 = absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar1,local_70);
            pLVar1 = absl::lts_20240722::log_internal::LogMessage::operator<<
                               (pLVar1,(char (*) [4])0x6716cc);
            absl::lts_20240722::log_internal::LogMessage::operator<<
                      (pLVar1,this_local,message_local._M_len);
            absl::lts_20240722::log_internal::LogMessage::~LogMessage(local_80);
            local_69 = 0;
          }
          local_69 = 0;
        }
        local_69 = 0;
      }
    }
    else {
      local_29 = 1;
      while (local_29 != 0) {
        while( true ) {
          local_b1 = 0;
          if (local_29 != 0) {
            local_b1 = absl::lts_20240722::log_internal::LogEveryPow2State::ShouldLog();
          }
          if ((local_b1 & 1) == 0) break;
          local_30 = absl::lts_20240722::log_internal::LogEveryPow2State::counter
                               (&ReportWarning::absl_log_internal_stateful_condition_state);
          while ((local_29 & 1) != 0) {
            absl::lts_20240722::log_internal::LogMessage::LogMessage
                      (local_40,
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/text_format.cc"
                       ,0x1bd);
            pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream(local_40);
            pLVar1 = absl::lts_20240722::log_internal::LogMessage::operator<<
                               (pLVar1,(char (*) [29])"Warning parsing text-format ");
            psVar2 = Descriptor::full_name_abi_cxx11_(this->root_message_type_);
            pLVar1 = (LogMessage *)
                     absl::lts_20240722::log_internal::LogMessage::operator<<
                               (pLVar1,(string *)psVar2);
            pLVar1 = absl::lts_20240722::log_internal::LogMessage::operator<<
                               (pLVar1,(char (*) [3])0x6b7fb4);
            pLVar1 = absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar1,iStack_24 + 1);
            pLVar1 = absl::lts_20240722::log_internal::LogMessage::operator<<
                               (pLVar1,(char (*) [2])0x6d51fe);
            pLVar1 = absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar1,COUNTER + 1);
            pLVar1 = absl::lts_20240722::log_internal::LogMessage::operator<<
                               (pLVar1,(char (*) [7])" (N = ");
            pLVar1 = absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar1,local_30);
            pLVar1 = absl::lts_20240722::log_internal::LogMessage::operator<<
                               (pLVar1,(char (*) [4])0x6716cc);
            COUNTER_1 = (uint32_t)this_local;
            uStack_64 = this_local._4_4_;
            uStack_60 = (undefined4)message_local._M_len;
            uStack_5c = message_local._M_len._4_4_;
            absl::lts_20240722::log_internal::LogMessage::operator<<
                      (pLVar1,this_local,message_local._M_len);
            absl::lts_20240722::log_internal::LogMessage::~LogMessage(local_40);
            local_29 = 0;
          }
          local_29 = 0;
        }
        local_29 = 0;
      }
    }
  }
  else {
    (*this->error_collector_->_vptr_ErrorCollector[3])
              (this->error_collector_,(ulong)(uint)line,(ulong)(uint)col,this_local,
               message_local._M_len);
  }
  return;
}

Assistant:

void ReportWarning(int line, int col, const absl::string_view message) {
    if (error_collector_ == nullptr) {
      if (line >= 0) {
        ABSL_LOG_EVERY_POW_2(WARNING)
            << "Warning parsing text-format " << root_message_type_->full_name()
            << ": " << (line + 1) << ":" << (col + 1) << " (N = " << COUNTER
            << "): " << message;
      } else {
        ABSL_LOG_EVERY_POW_2(WARNING)
            << "Warning parsing text-format " << root_message_type_->full_name()
            << " (N = " << COUNTER << "): " << message;
      }
    } else {
      error_collector_->RecordWarning(line, col, message);
    }
  }